

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

void os_remext(char *fn)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RDI;
  char *p;
  char *local_10;
  
  sVar1 = strlen(in_RDI);
  local_10 = in_RDI + sVar1;
  do {
    if (local_10 <= in_RDI) {
      return;
    }
    local_10 = local_10 + -1;
    if (*local_10 == '.') {
      *local_10 = '\0';
      return;
    }
    if (*local_10 == '/') {
      return;
    }
  } while ((*local_10 == '\0') || (pcVar2 = strchr("",(int)*local_10), pcVar2 == (char *)0x0));
  return;
}

Assistant:

void os_remext(char *fn)
{
    char *p;

    /* scan backwards from the end of the string, looking for a dot */
    p = fn + strlen(fn);
    while ( p>fn )
    {
        /* move to the previous character */
        p--;

        /* if it's a period, we've found the extension */
        if ( *p=='.' )
        {
            /* terminate the string here to remove the extension */
            *p = '\0';

            /* we're done */
            return;
        }

        /* 
         *   if this is a path separator, there's no extension, so we can
         *   stop looking 
         */
        if (ispathchar(*p))
            return;
    }
}